

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::RandomUniformDynamicLayerParams::~RandomUniformDynamicLayerParams
          (RandomUniformDynamicLayerParams *this)

{
  ~RandomUniformDynamicLayerParams(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

RandomUniformDynamicLayerParams::~RandomUniformDynamicLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.RandomUniformDynamicLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}